

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

bool absl::lts_20250127::Cord::GetFlatAux
               (Nonnull<CordRep_*> rep,Nonnull<absl::string_view_*> fragment)

{
  bool bVar1;
  CordRepSubstring *pCVar2;
  CordRepFlat *pCVar3;
  char *pcVar4;
  CordRepExternal *pCVar5;
  CordRepBtree *pCVar6;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  CordRep *local_58;
  CordRep *child;
  char *local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  Nonnull<absl::string_view_*> local_20;
  Nonnull<absl::string_view_*> fragment_local;
  Nonnull<CordRep_*> rep_local;
  
  local_20 = fragment;
  fragment_local = (Nonnull<absl::string_view_*>)rep;
  if (rep == (Nonnull<CordRep_*>)0x0) {
    __assert_fail("rep != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                  ,0x57a,
                  "static bool absl::Cord::GetFlatAux(absl::Nonnull<CordRep *>, absl::Nonnull<absl::string_view *>)"
                 );
  }
  if (rep->length == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30);
    local_20->_M_len = local_30._M_len;
    local_20->_M_str = local_30._M_str;
    rep_local._7_1_ = true;
  }
  else {
    fragment_local = (Nonnull<absl::string_view_*>)cord_internal::SkipCrcNode(rep);
    bVar1 = cord_internal::CordRep::IsFlat((CordRep *)fragment_local);
    if (bVar1) {
      pCVar3 = cord_internal::CordRep::flat((CordRep *)fragment_local);
      pcVar4 = cord_internal::CordRepFlat::Data(pCVar3);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_40,pcVar4,fragment_local->_M_len);
      local_20->_M_len = local_40._M_len;
      local_20->_M_str = local_40._M_str;
      rep_local._7_1_ = true;
    }
    else {
      bVar1 = cord_internal::CordRep::IsExternal((CordRep *)fragment_local);
      if (bVar1) {
        pCVar5 = cord_internal::CordRep::external((CordRep *)fragment_local);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&child,pCVar5->base,
                   fragment_local->_M_len);
        local_20->_M_len = (size_t)child;
        local_20->_M_str = local_48;
        rep_local._7_1_ = true;
      }
      else {
        bVar1 = cord_internal::CordRep::IsBtree((CordRep *)fragment_local);
        if (bVar1) {
          pCVar6 = cord_internal::CordRep::btree((CordRep *)fragment_local);
          rep_local._7_1_ = cord_internal::CordRepBtree::IsFlat(pCVar6,local_20);
        }
        else {
          bVar1 = cord_internal::CordRep::IsSubstring((CordRep *)fragment_local);
          if (bVar1) {
            pCVar2 = cord_internal::CordRep::substring((CordRep *)fragment_local);
            local_58 = pCVar2->child;
            bVar1 = cord_internal::CordRep::IsFlat(local_58);
            if (bVar1) {
              pCVar3 = cord_internal::CordRep::flat(local_58);
              pcVar4 = cord_internal::CordRepFlat::Data(pCVar3);
              pCVar2 = cord_internal::CordRep::substring((CordRep *)fragment_local);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_68,pcVar4 + pCVar2->start,fragment_local->_M_len);
              local_20->_M_len = local_68._M_len;
              local_20->_M_str = local_68._M_str;
              return true;
            }
            bVar1 = cord_internal::CordRep::IsExternal(local_58);
            if (bVar1) {
              pCVar5 = cord_internal::CordRep::external(local_58);
              pcVar4 = pCVar5->base;
              pCVar2 = cord_internal::CordRep::substring((CordRep *)fragment_local);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_78,pcVar4 + pCVar2->start,fragment_local->_M_len);
              local_20->_M_len = local_78._M_len;
              local_20->_M_str = local_78._M_str;
              return true;
            }
            bVar1 = cord_internal::CordRep::IsBtree(local_58);
            if (bVar1) {
              pCVar6 = cord_internal::CordRep::btree(local_58);
              pCVar2 = cord_internal::CordRep::substring((CordRep *)fragment_local);
              bVar1 = cord_internal::CordRepBtree::IsFlat
                                (pCVar6,pCVar2->start,fragment_local->_M_len,local_20);
              return bVar1;
            }
          }
          rep_local._7_1_ = false;
        }
      }
    }
  }
  return rep_local._7_1_;
}

Assistant:

bool Cord::GetFlatAux(absl::Nonnull<CordRep*> rep,
                                   absl::Nonnull<absl::string_view*> fragment) {
  assert(rep != nullptr);
  if (rep->length == 0) {
    *fragment = absl::string_view();
    return true;
  }
  rep = cord_internal::SkipCrcNode(rep);
  if (rep->IsFlat()) {
    *fragment = absl::string_view(rep->flat()->Data(), rep->length);
    return true;
  } else if (rep->IsExternal()) {
    *fragment = absl::string_view(rep->external()->base, rep->length);
    return true;
  } else if (rep->IsBtree()) {
    return rep->btree()->IsFlat(fragment);
  } else if (rep->IsSubstring()) {
    CordRep* child = rep->substring()->child;
    if (child->IsFlat()) {
      *fragment = absl::string_view(
          child->flat()->Data() + rep->substring()->start, rep->length);
      return true;
    } else if (child->IsExternal()) {
      *fragment = absl::string_view(
          child->external()->base + rep->substring()->start, rep->length);
      return true;
    } else if (child->IsBtree()) {
      return child->btree()->IsFlat(rep->substring()->start, rep->length,
                                    fragment);
    }
  }
  return false;
}